

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O1

atomic_counter_t * __thiscall zmq::msg_t::refcnt(msg_t *this)

{
  uchar uVar1;
  
  uVar1 = (this->_u).base.type;
  if ((uVar1 != 'i') && (uVar1 != 'f')) {
    refcnt();
    return (atomic_counter_t *)0x0;
  }
  return &((this->_u).lmsg.content)->refcnt;
}

Assistant:

zmq::atomic_counter_t *zmq::msg_t::refcnt ()
{
    switch (_u.base.type) {
        case type_lmsg:
            return &_u.lmsg.content->refcnt;
        case type_zclmsg:
            return &_u.zclmsg.content->refcnt;
        default:
            zmq_assert (false);
            return NULL;
    }
}